

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O2

void deqp::gls::StateQueryUtil::verifyFloatMax
               (ResultCollector *result,QueriedState *state,float maxValue)

{
  ostream *poVar1;
  float fVar2;
  ostringstream buf;
  string local_1c0;
  string local_1a0 [11];
  
  switch(state->m_type) {
  case DATATYPE_BOOLEAN:
    if (0.0 <= maxValue) {
      return;
    }
    if ((state->m_v).vBool != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a0,"expected GL_TRUE, got GL_FALSE",(allocator<char> *)&local_1c0);
    tcu::ResultCollector::fail(result,local_1a0);
    std::__cxx11::string::~string((string *)local_1a0);
    return;
  case DATATYPE_INTEGER:
    fVar2 = floorf(maxValue + 0.5);
    if ((state->m_v).vInt <= (int)fVar2) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    poVar1 = std::operator<<((ostream *)local_1a0,"Expected less or equal to ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)fVar2);
    poVar1 = std::operator<<(poVar1,", got ");
    std::ostream::operator<<(poVar1,(state->m_v).vInt);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1c0);
    break;
  case DATATYPE_INTEGER64:
    fVar2 = floorf(maxValue + 0.5);
    if ((state->m_v).vInt64 <= (long)fVar2) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    poVar1 = std::operator<<((ostream *)local_1a0,"Expected less or equal to ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    poVar1 = std::operator<<(poVar1,", got ");
    std::ostream::_M_insert<long>((long)poVar1);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1c0);
    break;
  case DATATYPE_FLOAT:
    if (((state->m_v).vFloat <= maxValue) && (!NAN((state->m_v).vFloat))) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    poVar1 = std::operator<<((ostream *)local_1a0,"Expected less or equal to ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,maxValue);
    poVar1 = std::operator<<(poVar1,", got ");
    std::ostream::operator<<(poVar1,(state->m_v).vFloat);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1c0);
    break;
  default:
    goto switchD_0083493a_default;
  }
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
switchD_0083493a_default:
  return;
}

Assistant:

DataType QueriedState::getType (void) const
{
	return m_type;
}